

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::
    reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_d,bool reduce_c,
              bool post_process,float coeff,int keepdims,Option *opt)

{
  int iVar1;
  Mat *opt_00;
  
  opt_00 = b;
  iVar1 = reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                    (a,b,v0,reduce_w,reduce_h,reduce_d,reduce_c,keepdims,opt);
  if (iVar1 == 0) {
    if ((post_process) || (iVar1 = 0, 1.1920929e-07 < ABS(v0 + -1.0))) {
      reduction_post_process<ncnn::post_process_identity<float>>(b,v0,(Option *)opt_00);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = -100;
  }
  return iVar1;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_d, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_d, reduce_c, keepdims, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabsf(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }

    return 0;
}